

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_CreateDescriptor_wpkh_Test::TestBody(Descriptor_CreateDescriptor_wpkh_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_5a0;
  AssertHelper local_580;
  AssertionResult gtest_ar_;
  AssertHelper local_568;
  string desc_str;
  string local_540;
  string pubkey_str;
  string parent_info;
  string ext_descriptor;
  AssertionResult gtest_ar;
  DescriptorKeyInfo key_info;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&ext_descriptor,
             "wpkh([1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)#r5cw72t3"
             ,(allocator *)&key_info);
  std::__cxx11::string::string
            ((string *)&parent_info,"[1422fcb3/0\'/0\'/68\']",(allocator *)&key_info);
  std::__cxx11::string::string
            ((string *)&pubkey_str,
             "02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995",
             (allocator *)&key_info);
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&key_info);
  cfd::core::Descriptor::Descriptor(&desc);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_5a0,&pubkey_str);
      std::__cxx11::string::string((string *)&local_540,(string *)&parent_info);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                ((DescriptorKeyInfo *)&gtest_ar,(Pubkey *)&local_5a0,&local_540);
      cfd::core::DescriptorKeyInfo::operator=(&key_info,(DescriptorKeyInfo *)&gtest_ar);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo((DescriptorKeyInfo *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_540);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d4,
               "Expected: key_info = DescriptorKeyInfo(Pubkey(pubkey_str), parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::CreateDescriptor
                ((Descriptor *)&gtest_ar,kDescriptorScriptWpkh,&key_info,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
      cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d5,
               "Expected: desc = Descriptor::CreateDescriptor(DescriptorScriptType::kDescriptorScriptWpkh, key_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&gtest_ar,&desc,true);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d6,
               "Expected: desc_str = desc.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"desc_str.c_str()","ext_descriptor.c_str()",
             desc_str._M_dataplus._M_p,ext_descriptor._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_5a0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Descriptor::GetKeyData((KeyData *)&gtest_ar,&desc);
  gtest_ar_.success_ = cfd::core::KeyData::IsValid((KeyData *)&gtest_ar);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5a0,(internal *)&gtest_ar_,(AssertionResult *)0x412c07,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3da,local_5a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_568,(Message *)&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    std::__cxx11::string::~string((string *)&local_5a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_580);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_5a0,(KeyData *)&gtest_ar,true,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"key.ToString().c_str()",
             "\"[1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995\""
             ,local_5a0._M_dataplus._M_p,
             "[1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995"
            );
  std::__cxx11::string::~string((string *)&local_5a0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_5a0);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x3dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&key_info);
  std::__cxx11::string::~string((string *)&pubkey_str);
  std::__cxx11::string::~string((string *)&parent_info);
  std::__cxx11::string::~string((string *)&ext_descriptor);
  return;
}

Assistant:

TEST(Descriptor, CreateDescriptor_wpkh) {
  std::string ext_descriptor = "wpkh([1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)#r5cw72t3";
  std::string parent_info = "[1422fcb3/0'/0'/68']";
  std::string pubkey_str = "02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995";
  DescriptorKeyInfo key_info;
  Descriptor desc;
  std::string desc_str = "";

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(Pubkey(pubkey_str), parent_info));
  EXPECT_NO_THROW(desc = Descriptor::CreateDescriptor(DescriptorScriptType::kDescriptorScriptWpkh, key_info));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), ext_descriptor.c_str());
  try {
    auto key = desc.GetKeyData();
    EXPECT_TRUE(key.IsValid());
    EXPECT_STREQ(key.ToString().c_str(),
      "[1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995");
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}